

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf-test.cc
# Opt level: O0

void __thiscall PrintfTest_VPrintf_Test::TestBody(PrintfTest_VPrintf_Test *this)

{
  basic_format_args<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>
  args_00;
  basic_format_args<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>
  args_01;
  basic_format_args<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>
  args_02;
  bool bVar1;
  AssertionResult *pAVar2;
  string gtest_output_2;
  OutputRedirect gtest_redir_2;
  string gtest_expected_output_2;
  AssertionResult gtest_ar_3;
  string gtest_output_1;
  OutputRedirect gtest_redir_1;
  string gtest_expected_output_1;
  AssertionResult gtest_ar_2;
  string gtest_output;
  OutputRedirect gtest_redir;
  string gtest_expected_output;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  basic_format_args<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>
  args;
  format_arg_store<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_int>
  as;
  OutputRedirect *in_stack_00000ce8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffca8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcb8;
  OutputRedirect *in_stack_fffffffffffffcc0;
  char *in_stack_fffffffffffffcc8;
  int line;
  AssertionResult *in_stack_fffffffffffffcd0;
  undefined4 in_stack_fffffffffffffcd8;
  Type in_stack_fffffffffffffcdc;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>_2
  in_stack_fffffffffffffce0;
  undefined7 in_stack_fffffffffffffd28;
  undefined1 in_stack_fffffffffffffd2f;
  allocator *in_stack_fffffffffffffd30;
  string local_238 [32];
  undefined8 local_218;
  undefined8 uStack_210;
  allocator<char> local_1e9;
  string local_1e8 [32];
  AssertionResult local_1c8 [2];
  string local_1a8 [32];
  undefined8 local_188;
  undefined8 uStack_180;
  allocator local_161;
  string local_160 [32];
  AssertionResult local_140 [2];
  int local_11c;
  string local_118 [32];
  undefined8 local_f8;
  undefined8 uStack_f0;
  char (*in_stack_ffffffffffffff18) [3];
  basic_ostream<char,_std::char_traits<char>_> *in_stack_ffffffffffffff20;
  char (*in_stack_ffffffffffffff28) [3];
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>_2
  in_stack_ffffffffffffff30;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>_2
  in_stack_ffffffffffffff38;
  FILE *in_stack_ffffffffffffff40;
  basic_format_args<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>
  in_stack_ffffffffffffff48;
  AssertionResult local_a8 [3];
  undefined8 local_78;
  undefined8 uStack_70;
  string local_60 [32];
  AssertionResult local_40;
  undefined8 local_30;
  undefined8 uStack_28;
  undefined4 local_1c;
  
  local_1c = 0x2a;
  fmt::v5::
  format_arg_store<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_int>
  ::format_arg_store((format_arg_store<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_int>
                      *)in_stack_fffffffffffffcb0,(int *)in_stack_fffffffffffffca8);
  fmt::v5::
  basic_format_args<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>
  ::basic_format_args<int>
            ((basic_format_args<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>
              *)in_stack_fffffffffffffcb0,
             (format_arg_store<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_int>
              *)in_stack_fffffffffffffca8);
  local_78 = local_30;
  uStack_70 = uStack_28;
  args_02.field_1.values_ = in_stack_ffffffffffffff38.values_;
  args_02.types_ = (unsigned_long_long)in_stack_ffffffffffffff30.values_;
  fmt::v5::vsprintf<char[3],char>(in_stack_ffffffffffffff28,args_02);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,char[3]>
            (in_stack_fffffffffffffcc8,(char *)in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,
             (char (*) [3])in_stack_fffffffffffffcb0);
  line = (int)((ulong)in_stack_fffffffffffffcc8 >> 0x20);
  std::__cxx11::string::~string(local_60);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_40);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffce0.values_);
    testing::AssertionResult::failure_message((AssertionResult *)0x138534);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffce0.values_,in_stack_fffffffffffffcdc,
               &in_stack_fffffffffffffcd0->success_,line,(char *)in_stack_fffffffffffffcc0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffd30,
               (Message *)CONCAT17(in_stack_fffffffffffffd2f,in_stack_fffffffffffffd28));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffcb0);
    testing::Message::~Message((Message *)0x138597);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1385ef);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_a8);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xffffffffffffff38,"42",(allocator *)&stack0xffffffffffffff37);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff37);
    OutputRedirect::OutputRedirect
              ((OutputRedirect *)in_stack_fffffffffffffce0.values_,
               (FILE *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_f8 = local_30;
      uStack_f0 = uStack_28;
      args_00.types_._4_4_ = in_stack_fffffffffffffcdc;
      args_00.types_._0_4_ = in_stack_fffffffffffffcd8;
      args_00.field_1.values_ = in_stack_fffffffffffffce0.values_;
      fmt::v5::vprintf<char[3],char>(&in_stack_fffffffffffffcd0->success_,args_00);
    }
    OutputRedirect::restore_and_read_abi_cxx11_(in_stack_00000ce8);
    bVar1 = std::operator!=(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
    if (bVar1) {
      testing::AssertionResult::operator<<
                ((AssertionResult *)in_stack_fffffffffffffce0.values_,
                 (char (*) [53])CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
      testing::AssertionResult::operator<<
                ((AssertionResult *)in_stack_fffffffffffffce0.values_,
                 (char (*) [11])CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
      testing::AssertionResult::operator<<
                ((AssertionResult *)in_stack_fffffffffffffce0.values_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
      testing::AssertionResult::operator<<
                ((AssertionResult *)in_stack_fffffffffffffce0.values_,
                 (char (*) [2])CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
      testing::AssertionResult::operator<<
                ((AssertionResult *)in_stack_fffffffffffffce0.values_,
                 (char (*) [11])CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
      testing::AssertionResult::operator<<
                ((AssertionResult *)in_stack_fffffffffffffce0.values_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
      local_11c = 2;
    }
    else {
      local_11c = 0;
    }
    std::__cxx11::string::~string(local_118);
    OutputRedirect::~OutputRedirect(in_stack_fffffffffffffcc0);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff38);
    if (local_11c != 0) goto LAB_001388d1;
  }
  else {
LAB_001388d1:
    testing::Message::Message((Message *)in_stack_fffffffffffffce0.values_);
    testing::AssertionResult::failure_message((AssertionResult *)0x1388ed);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffce0.values_,in_stack_fffffffffffffcdc,
               &in_stack_fffffffffffffcd0->success_,line,(char *)in_stack_fffffffffffffcc0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffd30,
               (Message *)CONCAT17(in_stack_fffffffffffffd2f,in_stack_fffffffffffffd28));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffcb0);
    testing::Message::~Message((Message *)0x138950);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1389a8);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_140);
  if (bVar1) {
    in_stack_fffffffffffffd30 = &local_161;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_160,"42",in_stack_fffffffffffffd30);
    std::allocator<char>::~allocator((allocator<char> *)&local_161);
    OutputRedirect::OutputRedirect
              ((OutputRedirect *)in_stack_fffffffffffffce0.values_,
               (FILE *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
    in_stack_fffffffffffffd2f = testing::internal::AlwaysTrue();
    if ((bool)in_stack_fffffffffffffd2f) {
      local_188 = local_30;
      uStack_180 = uStack_28;
      fmt::v5::vfprintf<char[3],char>
                (in_stack_ffffffffffffff40,(char (*) [3])in_stack_ffffffffffffff38.values_,
                 in_stack_ffffffffffffff48);
    }
    OutputRedirect::restore_and_read_abi_cxx11_(in_stack_00000ce8);
    bVar1 = std::operator!=(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
    if (bVar1) {
      testing::AssertionResult::operator<<
                ((AssertionResult *)in_stack_fffffffffffffce0.values_,
                 (char (*) [62])CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
      testing::AssertionResult::operator<<
                ((AssertionResult *)in_stack_fffffffffffffce0.values_,
                 (char (*) [11])CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
      testing::AssertionResult::operator<<
                ((AssertionResult *)in_stack_fffffffffffffce0.values_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
      testing::AssertionResult::operator<<
                ((AssertionResult *)in_stack_fffffffffffffce0.values_,
                 (char (*) [2])CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
      testing::AssertionResult::operator<<
                ((AssertionResult *)in_stack_fffffffffffffce0.values_,
                 (char (*) [11])CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
      testing::AssertionResult::operator<<
                ((AssertionResult *)in_stack_fffffffffffffce0.values_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
      local_11c = 3;
    }
    else {
      local_11c = 0;
    }
    std::__cxx11::string::~string(local_1a8);
    OutputRedirect::~OutputRedirect(in_stack_fffffffffffffcc0);
    std::__cxx11::string::~string(local_160);
    if (local_11c != 0) goto LAB_00138c76;
  }
  else {
LAB_00138c76:
    testing::Message::Message((Message *)in_stack_fffffffffffffce0.values_);
    testing::AssertionResult::failure_message((AssertionResult *)0x138c92);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffce0.values_,in_stack_fffffffffffffcdc,
               &in_stack_fffffffffffffcd0->success_,line,(char *)in_stack_fffffffffffffcc0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffd30,
               (Message *)CONCAT17(in_stack_fffffffffffffd2f,in_stack_fffffffffffffd28));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffcb0);
    testing::Message::~Message((Message *)0x138cef);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x138d47);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1c8);
  if (bVar1) {
    in_stack_fffffffffffffce0.values_ =
         (value<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>
          *)&local_1e9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1e8,"42",(allocator *)in_stack_fffffffffffffce0.values_);
    std::allocator<char>::~allocator(&local_1e9);
    OutputRedirect::OutputRedirect
              ((OutputRedirect *)in_stack_fffffffffffffce0.values_,
               (FILE *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
    bVar1 = testing::internal::AlwaysTrue();
    in_stack_fffffffffffffcdc = CONCAT13(bVar1,(int3)in_stack_fffffffffffffcdc);
    if (bVar1) {
      local_218 = local_30;
      uStack_210 = uStack_28;
      args_01.field_1.values_ = in_stack_ffffffffffffff30.values_;
      args_01.types_ = (unsigned_long_long)in_stack_ffffffffffffff28;
      fmt::v5::vfprintf<char[3],char>(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,args_01);
    }
    OutputRedirect::restore_and_read_abi_cxx11_(in_stack_00000ce8);
    bVar1 = std::operator!=(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
    if (bVar1) {
      in_stack_fffffffffffffcd0 =
           testing::AssertionResult::operator<<
                     ((AssertionResult *)in_stack_fffffffffffffce0.values_,
                      (char (*) [65])CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
      pAVar2 = testing::AssertionResult::operator<<
                         ((AssertionResult *)in_stack_fffffffffffffce0.values_,
                          (char (*) [11])
                          CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
      line = (int)((ulong)pAVar2 >> 0x20);
      in_stack_fffffffffffffcc0 =
           (OutputRedirect *)
           testing::AssertionResult::operator<<
                     ((AssertionResult *)in_stack_fffffffffffffce0.values_,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
      testing::AssertionResult::operator<<
                ((AssertionResult *)in_stack_fffffffffffffce0.values_,
                 (char (*) [2])CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
      in_stack_fffffffffffffcb0 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           testing::AssertionResult::operator<<
                     ((AssertionResult *)in_stack_fffffffffffffce0.values_,
                      (char (*) [11])CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
      testing::AssertionResult::operator<<
                ((AssertionResult *)in_stack_fffffffffffffce0.values_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
      local_11c = 4;
    }
    else {
      local_11c = 0;
    }
    std::__cxx11::string::~string(local_238);
    OutputRedirect::~OutputRedirect(in_stack_fffffffffffffcc0);
    std::__cxx11::string::~string(local_1e8);
    if (local_11c == 0) goto LAB_001390b9;
  }
  testing::Message::Message((Message *)in_stack_fffffffffffffce0.values_);
  testing::AssertionResult::failure_message((AssertionResult *)0x139016);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)in_stack_fffffffffffffce0.values_,in_stack_fffffffffffffcdc,
             &in_stack_fffffffffffffcd0->success_,line,(char *)in_stack_fffffffffffffcc0);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)in_stack_fffffffffffffd30,
             (Message *)CONCAT17(in_stack_fffffffffffffd2f,in_stack_fffffffffffffd28));
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffcb0);
  testing::Message::~Message((Message *)0x139071);
LAB_001390b9:
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1390c6);
  return;
}

Assistant:

TEST(PrintfTest, VPrintf) {
  fmt::format_arg_store<fmt::printf_context, int> as{42};
  fmt::basic_format_args<fmt::printf_context> args(as);
  EXPECT_EQ(fmt::vsprintf("%d", args), "42");
  EXPECT_WRITE(stdout, fmt::vprintf("%d", args), "42");
  EXPECT_WRITE(stdout, fmt::vfprintf(stdout, "%d", args), "42");
  EXPECT_WRITE(stdout, fmt::vfprintf(std::cout, "%d", args), "42");
}